

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this,int side,int bc)

{
  long size;
  TPZGeoMesh *pTVar1;
  undefined1 auVar2 [16];
  int iVar3;
  MElementType MVar4;
  uint uVar5;
  ostream *poVar6;
  TPZGeoEl *gel;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  TPZManVector<long,_4> nodeindices;
  TPZStack<int,_10> LowAllSides;
  int64_t index;
  TPZManVector<int,_27> mapside;
  TPZGeoElSide BCGelside;
  TPZGeoElSide thisside;
  int local_18c;
  TPZManVector<long,_4> local_188;
  TPZManVector<int,_10> local_148;
  undefined1 local_f8 [8];
  TPZManVector<int,_27> local_f0;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  undefined4 extraout_var;
  long lVar12;
  
  if ((uint)side < 9) {
    local_18c = side + -4;
    iVar3 = pztopology::TPZQuadrilateral::GetSideOrient(&local_18c);
    MVar4 = pztopology::TPZQuadrilateral::Type(side);
    uVar5 = pztopology::TPZQuadrilateral::NSideNodes(side);
    if (EQuadrilateral < MVar4) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    size = *(long *)(&DAT_0151f750 + (ulong)MVar4 * 8);
    local_148.super_TPZVec<int>._vptr_TPZVec =
         (_func_int **)((ulong)local_148.super_TPZVec<int>._vptr_TPZVec._4_4_ << 0x20);
    TPZManVector<int,_27>::TPZManVector(&local_f0,size,(int *)&local_148);
    auVar2 = _DAT_014d28c0;
    lVar7 = size + -1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar10 = auVar10 ^ _DAT_014d28c0;
    auVar11 = _DAT_014d28b0;
    do {
      auVar13 = auVar11 ^ auVar2;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        local_f0.super_TPZVec<int>.fStore[lVar7] = (int)lVar7;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        local_f0.super_TPZVec<int>.fStore[lVar7 + 1] = (int)lVar7 + 1;
      }
      lVar7 = lVar7 + 2;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
    } while (size + 1 != lVar7);
    if (iVar3 == -1) {
      if (MVar4 == EQuadrilateral) {
        local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&local_148;
        local_148.super_TPZVec<int>.fNElements._0_4_ = 7;
        local_148.super_TPZVec<int>.fNElements._4_4_ = 6;
        local_148.super_TPZVec<int>.fNAlloc._0_4_ = 5;
        local_148.super_TPZVec<int>.fNAlloc._4_4_ = 4;
        local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x300000000;
        local_148.super_TPZVec<int>.fStore._0_4_ = 2;
        local_148.super_TPZVec<int>.fStore._4_4_ = 1;
        local_148.fExtAlloc[0] = 8;
        local_188.super_TPZVec<long>.fStore = (long *)0x9;
        TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_188);
      }
      else if (MVar4 == ETriangle) {
        local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&local_148;
        local_148.super_TPZVec<int>.fNElements._0_4_ = 4;
        local_148.super_TPZVec<int>.fNElements._4_4_ = 3;
        local_148.super_TPZVec<int>.fNAlloc._0_4_ = 6;
        local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x200000000;
        local_148.super_TPZVec<int>.fStore._0_4_ = 1;
        local_148.super_TPZVec<int>.fStore._4_4_ = 5;
        local_188.super_TPZVec<long>.fStore = (long *)0x7;
        TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_188);
      }
      else if (MVar4 == EOned) {
        local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&local_188;
        local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x1;
        local_188.super_TPZVec<long>.fStore =
             (long *)CONCAT44(local_188.super_TPZVec<long>.fStore._4_4_,2);
        local_148.super_TPZVec<int>.fStore._0_4_ = 3;
        local_148.super_TPZVec<int>.fStore._4_4_ = 0;
        TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_148);
      }
    }
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_148);
    pztopology::TPZQuadrilateral::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_148);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_148,side);
    TPZManVector<long,_4>::TPZManVector(&local_188,(long)(int)uVar5);
    if (0 < (int)uVar5) {
      uVar9 = 0;
      do {
        if (iVar3 == -1) {
          iVar8 = local_f0.super_TPZVec<int>.fStore[uVar9];
        }
        else {
          iVar8 = (int)uVar9;
        }
        lVar7 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,uVar9 & 0xffffffff);
        local_188.super_TPZVec<long>.fStore[iVar8] = lVar7;
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    MVar4 = pztopology::TPZQuadrilateral::Type(side);
    pTVar1 = (this->super_TPZGeoEl).fMesh;
    iVar3 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar1,(ulong)MVar4,&local_188,(ulong)(uint)bc,local_f8,1);
    gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar3);
    TPZGeoElSide::TPZGeoElSide(&local_60,gel);
    local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
    local_48.fGeoEl = &this->super_TPZGeoEl;
    local_48.fSide = side;
    TPZGeoElSide::InsertConnectivity(&local_60,&local_48,&local_f0.super_TPZVec<int>);
    (**(code **)(*(long *)gel + 0x78))(gel);
    if (local_188.super_TPZVec<long>.fStore != local_188.fExtAlloc) {
      local_188.super_TPZVec<long>.fNAlloc = 0;
      local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_188.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_188.super_TPZVec<long>.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_148);
    if (local_f0.super_TPZVec<int>.fStore != local_f0.fExtAlloc) {
      local_f0.super_TPZVec<int>.fNAlloc = 0;
      local_f0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_f0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_f0.super_TPZVec<int>.fStore);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,side);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    gel = (TPZGeoEl *)0x0;
  }
  return gel;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}